

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ParquetScanFunction::ParquetScanDeserialize
          (ParquetScanFunction *this,Deserializer *deserializer,TableFunction *function)

{
  MultiFileOptions file_options_p;
  pointer pbVar1;
  ClientContext *context;
  pointer pMVar2;
  pointer pFVar3;
  pointer *__ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path;
  pointer __args;
  _Head_base<0UL,_duckdb::MultiFileReader_*,_false> local_2f8;
  table_function_bind_replace_t local_2f0;
  _Head_base<0UL,_duckdb::MultiFileReader_*,_false> local_2e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_2e0;
  shared_ptr<duckdb::MultiFileList,_true> file_list;
  undefined8 uStack_2c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  files;
  vector<duckdb::Value,_true> file_path;
  undefined1 auStack_290 [32];
  _Head_base<0UL,_duckdb::BaseFileReaderOptions_*,_false> in_stack_fffffffffffffd90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  names;
  vector<duckdb::LogicalType,_true> types;
  table_function_bind_replace_t local_228 [8];
  shared_ptr<duckdb::MultiFileList,_true> local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  table_columns;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  ParquetOptionsSerialization serialization;
  MultiFileOptions local_c8;
  
  context = SerializationData::Get<duckdb::ClientContext&>
                      ((SerializationData *)(deserializer + 0x10));
  Deserializer::ReadProperty<duckdb::vector<std::__cxx11::string,true>>
            (&files,deserializer,100,"files");
  Deserializer::ReadProperty<duckdb::vector<duckdb::LogicalType,true>>
            (&types,deserializer,0x65,"types");
  Deserializer::ReadProperty<duckdb::vector<std::__cxx11::string,true>>
            (&names,deserializer,0x66,"names");
  Deserializer::ReadProperty<duckdb::ParquetOptionsSerialization>
            (&serialization,deserializer,0x67,"parquet_options");
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e0 = &table_columns;
  Deserializer::ReadPropertyWithExplicitDefault<duckdb::vector<std::__cxx11::string,true>>
            (local_2e0,deserializer,0x68,"table_columns",
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)&local_1b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b8);
  pbVar1 = files.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  file_path.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  file_path.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  file_path.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  for (__args = files.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; __args != pbVar1; __args = __args + 1) {
    std::vector<duckdb::Value,std::allocator<duckdb::Value>>::emplace_back<std::__cxx11::string&>
              ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&file_path,__args);
  }
  duckdb::MultiFileReader::Create((TableFunction *)&local_2f8);
  pMVar2 = unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>::
           operator->((unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
                       *)&local_2f8);
  duckdb::LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffffd90,VARCHAR);
  std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)(auStack_290 + 8),
             &file_path.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>);
  duckdb::Value::LIST(local_228,&stack0xfffffffffffffd90,auStack_290 + 8);
  duckdb::MultiFileReader::CreateFileList
            ((ClientContext *)&file_list,(Value *)pMVar2,(FileGlobOptions)context);
  duckdb::Value::~Value((Value *)local_228);
  std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)(auStack_290 + 8));
  duckdb::LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffffd90);
  make_uniq<duckdb::ParquetFileReaderOptions,duckdb::ParquetOptions>
            ((duckdb *)local_228,&serialization.parquet_options);
  local_2e8._M_head_impl = local_2f8._M_head_impl;
  local_2f8._M_head_impl = (MultiFileReader *)0x0;
  local_1e8.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_1e8.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  MultiFileOptions::MultiFileOptions(&local_c8,&serialization.file_options);
  local_2f0 = local_228[0];
  local_228[0] = (table_function_bind_replace_t)0x0;
  file_options_p.hive_types_schema._M_h._M_buckets = (__buckets_ptr)&local_2f0;
  file_options_p._0_8_ = &local_c8;
  file_options_p.hive_types_schema._M_h._M_bucket_count = (size_type)local_2f8._M_head_impl;
  file_options_p.hive_types_schema._M_h._M_before_begin._M_nxt = (_Hash_node_base *)local_2f0;
  file_options_p.hive_types_schema._M_h._M_element_count = (size_type)local_2e8._M_head_impl;
  file_options_p.hive_types_schema._M_h._M_rehash_policy._0_8_ = local_2e0;
  file_options_p.hive_types_schema._M_h._M_rehash_policy._M_next_resize =
       (size_t)file_list.internal.
               super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  file_options_p.hive_types_schema._M_h._M_single_bucket =
       (__node_base_ptr)
       file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  file_options_p.filename_column._M_dataplus._M_p = (pointer)uStack_2c8;
  file_options_p.filename_column._M_string_length =
       (size_type)
       files.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  file_options_p.filename_column.field_2._M_allocated_capacity =
       (size_type)
       files.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  file_options_p.filename_column.field_2._8_8_ =
       files.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  file_options_p.custom_options._M_h._M_buckets =
       (__buckets_ptr)
       file_path.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
       super__Vector_impl_data._M_start;
  file_options_p.custom_options._M_h._M_bucket_count =
       (size_type)
       file_path.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
       super__Vector_impl_data._M_finish;
  file_options_p.custom_options._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)
       file_path.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  file_options_p.custom_options._M_h._M_element_count = auStack_290._0_8_;
  file_options_p.custom_options._M_h._M_rehash_policy._M_max_load_factor = (float)auStack_290._8_4_;
  file_options_p.custom_options._M_h._M_rehash_policy._4_4_ = auStack_290._12_4_;
  file_options_p.custom_options._M_h._M_rehash_policy._M_next_resize = auStack_290._16_8_;
  file_options_p.custom_options._M_h._M_single_bucket = (__node_base_ptr)auStack_290._24_8_;
  MultiFileFunction<duckdb::ParquetMultiFileInfo>::MultiFileBindInternal
            ((MultiFileFunction<duckdb::ParquetMultiFileInfo> *)this,context,
             (unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
              *)&local_2e8,&local_1e8,&types,&names,file_options_p,
             (unique_ptr<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>,_true>
              )in_stack_fffffffffffffd90._M_head_impl);
  if (local_2f0 != (table_function_bind_replace_t)0x0) {
    (**(code **)(*(long *)local_2f0 + 8))();
  }
  local_2f0 = (table_function_bind_replace_t)0x0;
  MultiFileOptions::~MultiFileOptions(&local_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1e8.internal.
              super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (local_2e8._M_head_impl != (MultiFileReader *)0x0) {
    (**(code **)(*(long *)local_2e8._M_head_impl + 8))();
  }
  local_2e8._M_head_impl = (MultiFileReader *)0x0;
  pFVar3 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
           operator->((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                       *)this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(pFVar3 + 0x198),&table_columns);
  if (local_228[0] != (table_function_bind_replace_t)0x0) {
    (**(code **)(*(long *)local_228[0] + 8))();
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&file_list.internal.
              super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (local_2f8._M_head_impl != (MultiFileReader *)0x0) {
    (**(code **)(*(long *)local_2f8._M_head_impl + 8))();
  }
  std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            (&file_path.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&table_columns.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  ParquetOptionsSerialization::~ParquetOptionsSerialization(&serialization);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&names.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&files.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> ParquetScanDeserialize(Deserializer &deserializer, TableFunction &function) {
		auto &context = deserializer.Get<ClientContext &>();
		auto files = deserializer.ReadProperty<vector<string>>(100, "files");
		auto types = deserializer.ReadProperty<vector<LogicalType>>(101, "types");
		auto names = deserializer.ReadProperty<vector<string>>(102, "names");
		auto serialization = deserializer.ReadProperty<ParquetOptionsSerialization>(103, "parquet_options");
		auto table_columns =
		    deserializer.ReadPropertyWithExplicitDefault<vector<string>>(104, "table_columns", vector<string> {});

		vector<Value> file_path;
		for (auto &path : files) {
			file_path.emplace_back(path);
		}

		auto multi_file_reader = MultiFileReader::Create(function);
		auto file_list = multi_file_reader->CreateFileList(context, Value::LIST(LogicalType::VARCHAR, file_path),
		                                                   FileGlobOptions::DISALLOW_EMPTY);
		auto parquet_options = make_uniq<ParquetFileReaderOptions>(std::move(serialization.parquet_options));
		auto bind_data = MultiFileFunction<ParquetMultiFileInfo>::MultiFileBindInternal(
		    context, std::move(multi_file_reader), std::move(file_list), types, names,
		    std::move(serialization.file_options), std::move(parquet_options));
		bind_data->Cast<MultiFileBindData>().table_columns = std::move(table_columns);
		return bind_data;
	}